

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_12::WriteBatchItemPrinter::~WriteBatchItemPrinter(WriteBatchItemPrinter *this)

{
  WriteBatchItemPrinter *this_local;
  
  ~WriteBatchItemPrinter(this);
  operator_delete(this);
  return;
}

Assistant:

void Put(const Slice& key, const Slice& value) override {
    std::string r = "  put '";
    AppendEscapedStringTo(&r, key);
    r += "' '";
    AppendEscapedStringTo(&r, value);
    r += "'\n";
    dst_->Append(r);
  }